

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::aes_cbc_testvectors::test_method(aes_cbc_testvectors *this)

{
  long in_FS_OFFSET;
  allocator<char> local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"000102030405060708090A0B0C0D0E0F",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"6bc1bee22e409f96e93d7e117393172a",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"f58c4c04d6e5f1ba779eabfb5f7bfbd6",&local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,false,&local_70,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"F58C4C04D6E5F1BA779EABFB5F7BFBD6",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ae2d8a571e03ac9c9eb76fac45af8e51",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"9cfc4e967edb808d679f777bc6702c7d",&local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,false,&local_70,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"9CFC4E967EDB808D679F777BC6702C7D",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"30c81c46a35ce411e5fbc1191a0a52ef",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"39f23369a9d9bacfa530e26304231461",&local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,false,&local_70,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"39F23369A9D9BACFA530E26304231461",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"f69f2445df4f9b17ad2b417be66c3710",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"b2eb05e2c39be9fcda6c19078c6a9d1b",&local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,false,&local_70,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"000102030405060708090A0B0C0D0E0F",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"6bc1bee22e409f96e93d7e117393172a",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"f58c4c04d6e5f1ba779eabfb5f7bfbd6485a5c81519cf378fa36d42b8547edc0",
             &local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,true,&local_70,&local_90)
  ;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"F58C4C04D6E5F1BA779EABFB5F7BFBD6",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ae2d8a571e03ac9c9eb76fac45af8e51",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"9cfc4e967edb808d679f777bc6702c7d3a3aa5e0213db1a9901f9036cf5102d2",
             &local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,true,&local_70,&local_90)
  ;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"9CFC4E967EDB808D679F777BC6702C7D",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"30c81c46a35ce411e5fbc1191a0a52ef",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"39f23369a9d9bacfa530e263042314612f8da707643c90a6f732b3de1d3f5cee",
             &local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,true,&local_70,&local_90)
  ;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"39F23369A9D9BACFA530E26304231461",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"f69f2445df4f9b17ad2b417be66c3710",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"b2eb05e2c39be9fcda6c19078c6a9d1b3f461796d6b0d6b2e0c2a72b4d80e644",
             &local_94);
  CryptoTest::TestAES256CBC
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,true,&local_70,&local_90)
  ;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(aes_cbc_testvectors) {
    // NIST AES CBC 256-bit encryption test-vectors
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "000102030405060708090A0B0C0D0E0F", false, "6bc1bee22e409f96e93d7e117393172a", \
                  "f58c4c04d6e5f1ba779eabfb5f7bfbd6");
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "F58C4C04D6E5F1BA779EABFB5F7BFBD6", false, "ae2d8a571e03ac9c9eb76fac45af8e51", \
                  "9cfc4e967edb808d679f777bc6702c7d");
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "9CFC4E967EDB808D679F777BC6702C7D", false, "30c81c46a35ce411e5fbc1191a0a52ef",
                  "39f23369a9d9bacfa530e26304231461");
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "39F23369A9D9BACFA530E26304231461", false, "f69f2445df4f9b17ad2b417be66c3710", \
                  "b2eb05e2c39be9fcda6c19078c6a9d1b");

    // The same vectors with padding enabled
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "000102030405060708090A0B0C0D0E0F", true, "6bc1bee22e409f96e93d7e117393172a", \
                  "f58c4c04d6e5f1ba779eabfb5f7bfbd6485a5c81519cf378fa36d42b8547edc0");
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "F58C4C04D6E5F1BA779EABFB5F7BFBD6", true, "ae2d8a571e03ac9c9eb76fac45af8e51", \
                  "9cfc4e967edb808d679f777bc6702c7d3a3aa5e0213db1a9901f9036cf5102d2");
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "9CFC4E967EDB808D679F777BC6702C7D", true, "30c81c46a35ce411e5fbc1191a0a52ef",
                  "39f23369a9d9bacfa530e263042314612f8da707643c90a6f732b3de1d3f5cee");
    TestAES256CBC("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", \
                  "39F23369A9D9BACFA530E26304231461", true, "f69f2445df4f9b17ad2b417be66c3710", \
                  "b2eb05e2c39be9fcda6c19078c6a9d1b3f461796d6b0d6b2e0c2a72b4d80e644");
}